

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode Curl_ossl_verifyhost(Curl_easy *data,connectdata *conn,ssl_peer *peer,X509 *server_cert)

{
  Curl_easy *data_00;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  GENERAL_NAMES *a;
  int *piVar7;
  char *__s;
  size_t sVar8;
  undefined4 extraout_var;
  X509_NAME *name;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *x;
  uchar *__s_00;
  void *__src;
  undefined7 uVar9;
  ulong uVar10;
  CURLcode CVar11;
  char *pcVar12;
  int iVar13;
  size_t matchlen;
  bool bVar14;
  uchar *peer_CN;
  Curl_easy *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  X509 *local_58;
  char *local_50;
  ulong local_48;
  in6_addr addr;
  
  pcVar12 = peer->hostname;
  local_70 = (char *)strlen(pcVar12);
  if ((peer->field_0x18 & 1) == 0) {
    iVar4 = 2;
    uVar10 = 0;
  }
  else {
    if (((conn->bits).field_0x1 & 8) != 0) {
      iVar4 = inet_pton(10,pcVar12,&addr);
      if (iVar4 != 0) {
        iVar4 = 7;
        uVar10 = 0x10;
        goto LAB_005dacb7;
      }
      pcVar12 = peer->hostname;
    }
    iVar4 = inet_pton(2,pcVar12,&addr);
    uVar10 = (ulong)((uint)(iVar4 != 0) * 4);
    iVar4 = (uint)(iVar4 != 0) * 5 + 2;
  }
LAB_005dacb7:
  pcVar12 = (char *)0x0;
  local_58 = (X509 *)server_cert;
  a = (GENERAL_NAMES *)X509_get_ext_d2i((X509 *)server_cert,0x55,(int *)0x0,(int *)0x0);
  if (a != (GENERAL_NAMES *)0x0) {
    local_80 = data;
    local_48 = uVar10;
    iVar2 = OPENSSL_sk_num(a);
    iVar13 = 0;
    _Var1 = false;
    local_78 = (char *)0x0;
    local_60 = (char *)0x0;
    local_68 = (char *)0x0;
    while ((iVar13 < iVar2 && (_Var1 == false))) {
      piVar7 = (int *)OPENSSL_sk_value(a,iVar13);
      iVar3 = *piVar7;
      uVar9 = (undefined7)((ulong)pcVar12 >> 8);
      if (iVar3 == 2) {
        pcVar12 = (char *)CONCAT71(uVar9,1);
        local_68 = pcVar12;
      }
      else if (iVar3 == 7) {
        pcVar12 = (char *)CONCAT71(uVar9,1);
        local_60 = pcVar12;
      }
      if (iVar3 == iVar4) {
        __s = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar7 + 2));
        iVar3 = ASN1_STRING_length(*(ASN1_STRING **)(piVar7 + 2));
        matchlen = (size_t)iVar3;
        if (iVar4 == 7) {
          if (local_48 == matchlen) {
            bVar14 = local_80 != (Curl_easy *)0x0;
            iVar3 = bcmp(__s,&addr,local_48);
            pcVar12 = (char *)((ulong)pcVar12 & 0xffffffffffffff00);
            if (iVar3 == 0 && bVar14) {
              local_78 = (char *)CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
              if (((local_80->set).field_0x8bd & 0x10) != 0) {
                _Var1 = false;
                Curl_infof(local_80," subjectAltName: host \"%s\" matched cert\'s IP address!",
                           peer->dispname);
                goto LAB_005dae37;
              }
            }
            else {
              pcVar12 = (char *)CONCAT71((int7)((ulong)local_78 >> 8),(byte)local_78 | iVar3 == 0);
              local_78 = pcVar12;
            }
          }
          goto LAB_005dae34;
        }
        if ((iVar4 != 2) || (sVar8 = strlen(__s), sVar8 != matchlen)) goto LAB_005dae34;
        local_50 = peer->dispname;
        pcVar12 = local_70;
        _Var1 = Curl_cert_hostcheck(__s,matchlen,peer->hostname,(size_t)local_70);
        if (((local_80 != (Curl_easy *)0x0) && (_Var1)) &&
           (((local_80->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(local_80," subjectAltName: host \"%s\" matched cert\'s \"%s\"",local_50,__s);
          pcVar12 = __s;
        }
      }
      else {
LAB_005dae34:
        _Var1 = false;
      }
LAB_005dae37:
      iVar13 = iVar13 + 1;
    }
    GENERAL_NAMES_free(a);
    data_00 = local_80;
    if (_Var1 != false || ((ulong)local_78 & 1) != 0) {
      return CURLE_OK;
    }
    data = local_80;
    if ((((byte)local_68 | (byte)local_60) & 1) != 0) {
      if ((local_80 != (Curl_easy *)0x0) && (((local_80->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(local_80," subjectAltName does not match %s",peer->dispname);
      }
      Curl_failf(data_00,
                 "SSL: no alternative certificate subject name matches target host name \'%s\'",
                 peer->dispname);
      return CURLE_PEER_FAILED_VERIFICATION;
    }
  }
  peer_CN = (uchar *)0x0;
  name = X509_get_subject_name(local_58);
  if (name == (X509_NAME *)0x0) {
LAB_005db017:
    pcVar12 = "SSL: unable to obtain common name from peer certificate";
LAB_005db01e:
    Curl_failf(data,pcVar12);
  }
  else {
    iVar4 = -1;
    do {
      iVar2 = iVar4;
      iVar4 = X509_NAME_get_index_by_NID(name,0xd,iVar2);
    } while (-1 < iVar4);
    if (iVar2 < 0) goto LAB_005db017;
    ne = X509_NAME_get_entry(name,iVar2);
    x = X509_NAME_ENTRY_get_data(ne);
    if (x == (ASN1_STRING *)0x0) goto LAB_005db017;
    iVar4 = ASN1_STRING_type(x);
    if (iVar4 != 0xc) {
      uVar5 = ASN1_STRING_to_UTF8(&peer_CN,x);
      __s_00 = peer_CN;
      if (peer_CN != (uchar *)0x0) goto LAB_005dafaf;
      goto LAB_005db017;
    }
    uVar5 = ASN1_STRING_length(x);
    if ((int)uVar5 < 0) goto LAB_005db017;
    __s_00 = (uchar *)CRYPTO_malloc(uVar5 + 1,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                    ,0x8f1);
    if (__s_00 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    peer_CN = __s_00;
    __src = (void *)ASN1_STRING_get0_data(x);
    memcpy(__s_00,__src,(ulong)uVar5);
    __s_00[uVar5] = '\0';
LAB_005dafaf:
    sVar8 = strlen((char *)__s_00);
    uVar6 = curlx_uztosi(sVar8);
    if (uVar6 != uVar5) {
      pcVar12 = "SSL: illegal cert name field";
      goto LAB_005db01e;
    }
    if (peer_CN == (uchar *)0x0) goto LAB_005db017;
    _Var1 = Curl_cert_hostcheck((char *)peer_CN,(long)(int)uVar5,peer->hostname,(size_t)local_70);
    if (_Var1) {
      CVar11 = CURLE_OK;
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        CVar11 = CURLE_OK;
        Curl_infof(data," common name: %s (matched)",peer_CN);
      }
      goto LAB_005db02b;
    }
    Curl_failf(data,"SSL: certificate subject name \'%s\' does not match target host name \'%s\'",
               peer_CN,peer->dispname);
  }
  CVar11 = CURLE_PEER_FAILED_VERIFICATION;
LAB_005db02b:
  if (peer_CN != (uchar *)0x0) {
    CRYPTO_free(peer_CN);
  }
  return CVar11;
}

Assistant:

CURLcode Curl_ossl_verifyhost(struct Curl_easy *data, struct connectdata *conn,
                              struct ssl_peer *peer, X509 *server_cert)
{
  bool matched = FALSE;
  int target = GEN_DNS; /* target type, GEN_DNS or GEN_IPADD */
  size_t addrlen = 0;
  STACK_OF(GENERAL_NAME) *altnames;
#ifdef ENABLE_IPV6
  struct in6_addr addr;
#else
  struct in_addr addr;
#endif
  CURLcode result = CURLE_OK;
  bool dNSName = FALSE; /* if a dNSName field exists in the cert */
  bool iPAddress = FALSE; /* if a iPAddress field exists in the cert */
  size_t hostlen;

  (void)conn;
  hostlen = strlen(peer->hostname);
  if(peer->is_ip_address) {
#ifdef ENABLE_IPV6
    if(conn->bits.ipv6_ip &&
       Curl_inet_pton(AF_INET6, peer->hostname, &addr)) {
      target = GEN_IPADD;
      addrlen = sizeof(struct in6_addr);
    }
    else
#endif
      if(Curl_inet_pton(AF_INET, peer->hostname, &addr)) {
        target = GEN_IPADD;
        addrlen = sizeof(struct in_addr);
      }
  }

  /* get a "list" of alternative names */
  altnames = X509_get_ext_d2i(server_cert, NID_subject_alt_name, NULL, NULL);

  if(altnames) {
#if defined(OPENSSL_IS_BORINGSSL) || defined(OPENSSL_IS_AWSLC)
    size_t numalts;
    size_t i;
#else
    int numalts;
    int i;
#endif
    bool dnsmatched = FALSE;
    bool ipmatched = FALSE;

    /* get amount of alternatives, RFC2459 claims there MUST be at least
       one, but we don't depend on it... */
    numalts = sk_GENERAL_NAME_num(altnames);

    /* loop through all alternatives - until a dnsmatch */
    for(i = 0; (i < numalts) && !dnsmatched; i++) {
      /* get a handle to alternative name number i */
      const GENERAL_NAME *check = sk_GENERAL_NAME_value(altnames, i);

      if(check->type == GEN_DNS)
        dNSName = TRUE;
      else if(check->type == GEN_IPADD)
        iPAddress = TRUE;

      /* only check alternatives of the same type the target is */
      if(check->type == target) {
        /* get data and length */
        const char *altptr = (char *)ASN1_STRING_get0_data(check->d.ia5);
        size_t altlen = (size_t) ASN1_STRING_length(check->d.ia5);

        switch(target) {
        case GEN_DNS: /* name/pattern comparison */
          /* The OpenSSL man page explicitly says: "In general it cannot be
             assumed that the data returned by ASN1_STRING_data() is null
             terminated or does not contain embedded nulls." But also that
             "The actual format of the data will depend on the actual string
             type itself: for example for an IA5String the data will be ASCII"

             It has been however verified that in 0.9.6 and 0.9.7, IA5String
             is always null-terminated.
          */
          if((altlen == strlen(altptr)) &&
             /* if this isn't true, there was an embedded zero in the name
                string and we cannot match it. */
             subj_alt_hostcheck(data, altptr, altlen,
                                peer->hostname, hostlen,
                                peer->dispname)) {
            dnsmatched = TRUE;
          }
          break;

        case GEN_IPADD: /* IP address comparison */
          /* compare alternative IP address if the data chunk is the same size
             our server IP address is */
          if((altlen == addrlen) && !memcmp(altptr, &addr, altlen)) {
            ipmatched = TRUE;
            infof(data,
                  " subjectAltName: host \"%s\" matched cert's IP address!",
                  peer->dispname);
          }
          break;
        }
      }
    }
    GENERAL_NAMES_free(altnames);

    if(dnsmatched || ipmatched)
      matched = TRUE;
  }

  if(matched)
    /* an alternative name matched */
    ;
  else if(dNSName || iPAddress) {
    infof(data, " subjectAltName does not match %s", peer->dispname);
    failf(data, "SSL: no alternative certificate subject name matches "
          "target host name '%s'", peer->dispname);
    result = CURLE_PEER_FAILED_VERIFICATION;
  }
  else {
    /* we have to look to the last occurrence of a commonName in the
       distinguished one to get the most significant one. */
    int i = -1;
    unsigned char *peer_CN = NULL;
    int peerlen = 0;

    /* The following is done because of a bug in 0.9.6b */
    X509_NAME *name = X509_get_subject_name(server_cert);
    if(name) {
      int j;
      while((j = X509_NAME_get_index_by_NID(name, NID_commonName, i)) >= 0)
        i = j;
    }

    /* we have the name entry and we will now convert this to a string
       that we can use for comparison. Doing this we support BMPstring,
       UTF8, etc. */

    if(i >= 0) {
      ASN1_STRING *tmp =
        X509_NAME_ENTRY_get_data(X509_NAME_get_entry(name, i));

      /* In OpenSSL 0.9.7d and earlier, ASN1_STRING_to_UTF8 fails if the input
         is already UTF-8 encoded. We check for this case and copy the raw
         string manually to avoid the problem. This code can be made
         conditional in the future when OpenSSL has been fixed. */
      if(tmp) {
        if(ASN1_STRING_type(tmp) == V_ASN1_UTF8STRING) {
          peerlen = ASN1_STRING_length(tmp);
          if(peerlen >= 0) {
            peer_CN = OPENSSL_malloc(peerlen + 1);
            if(peer_CN) {
              memcpy(peer_CN, ASN1_STRING_get0_data(tmp), peerlen);
              peer_CN[peerlen] = '\0';
            }
            else
              result = CURLE_OUT_OF_MEMORY;
          }
        }
        else /* not a UTF8 name */
          peerlen = ASN1_STRING_to_UTF8(&peer_CN, tmp);

        if(peer_CN && (curlx_uztosi(strlen((char *)peer_CN)) != peerlen)) {
          /* there was a terminating zero before the end of string, this
             cannot match and we return failure! */
          failf(data, "SSL: illegal cert name field");
          result = CURLE_PEER_FAILED_VERIFICATION;
        }
      }
    }

    if(result)
      /* error already detected, pass through */
      ;
    else if(!peer_CN) {
      failf(data,
            "SSL: unable to obtain common name from peer certificate");
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else if(!Curl_cert_hostcheck((const char *)peer_CN,
                                 peerlen, peer->hostname, hostlen)) {
      failf(data, "SSL: certificate subject name '%s' does not match "
            "target host name '%s'", peer_CN, peer->dispname);
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else {
      infof(data, " common name: %s (matched)", peer_CN);
    }
    if(peer_CN)
      OPENSSL_free(peer_CN);
  }

  return result;
}